

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O2

int run_test_close_order(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = uv_default_loop();
  uv_check_init(loop,&check_handle);
  uv_check_start(&check_handle,check_cb);
  uv_timer_init(loop,&timer_handle1);
  uv_timer_start(&timer_handle1,timer_cb,0,0);
  uv_timer_init(loop,&timer_handle2);
  uv_timer_start(&timer_handle2,timer_cb,100000,0);
  eval_a = (int64_t)check_cb_called;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = (int64_t)close_cb_called;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = (int64_t)timer_cb_called;
      eval_b = 0;
      if (eval_a == 0) {
        uv_run(loop,UV_RUN_DEFAULT);
        eval_a = 1;
        eval_b = (int64_t)check_cb_called;
        if (eval_b == 1) {
          eval_a = 3;
          eval_b = (int64_t)close_cb_called;
          if (eval_b == 3) {
            eval_a = 1;
            eval_b = (int64_t)timer_cb_called;
            if (eval_b == 1) {
              uv_walk(loop,close_walk_cb,(void *)0x0);
              uv_run(loop,UV_RUN_DEFAULT);
              eval_a = 0;
              iVar1 = uv_loop_close(loop);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar3 = "uv_loop_close(loop)";
              pcVar2 = "0";
              uVar4 = 0x4e;
            }
            else {
              pcVar3 = "timer_cb_called";
              pcVar2 = "1";
              uVar4 = 0x4c;
            }
          }
          else {
            pcVar3 = "close_cb_called";
            pcVar2 = "3";
            uVar4 = 0x4b;
          }
        }
        else {
          pcVar3 = "check_cb_called";
          pcVar2 = "1";
          uVar4 = 0x4a;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "timer_cb_called";
        uVar4 = 0x46;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "close_cb_called";
      uVar4 = 0x45;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "check_cb_called";
    uVar4 = 0x44;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-order.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(close_order) {
  uv_loop_t* loop;
  loop = uv_default_loop();

  uv_check_init(loop, &check_handle);
  uv_check_start(&check_handle, check_cb);
  uv_timer_init(loop, &timer_handle1);
  uv_timer_start(&timer_handle1, timer_cb, 0, 0);
  uv_timer_init(loop, &timer_handle2);
  uv_timer_start(&timer_handle2, timer_cb, 100000, 0);

  ASSERT_OK(check_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(timer_cb_called);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, check_cb_called);
  ASSERT_EQ(3, close_cb_called);
  ASSERT_EQ(1, timer_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}